

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

Node * __thiscall Fl_Preferences::Node::find(Node *this,char *path)

{
  int iVar1;
  size_t sVar2;
  Node *pNVar3;
  char *__s;
  char *pcVar4;
  int iVar5;
  char *e;
  char *s;
  Node *nn;
  Node *nd;
  int len;
  char *path_local;
  Node *this_local;
  
  sVar2 = strlen(this->path_);
  iVar5 = (int)sVar2;
  iVar1 = strncmp(path,this->path_,(long)iVar5);
  if (iVar1 == 0) {
    if (path[iVar5] == '\0') {
      return this;
    }
    if (path[iVar5] == '/') {
      nn = this->child_;
      while( true ) {
        if (nn == (Node *)0x0) {
          __s = path + (long)iVar5 + 1;
          pcVar4 = strchr(__s,0x2f);
          if (pcVar4 == (char *)0x0) {
            fl_strlcpy(nameBuffer,__s,0x80);
          }
          else {
            fl_strlcpy(nameBuffer,__s,(size_t)(pcVar4 + (1 - (long)__s)));
          }
          pNVar3 = (Node *)operator_new(0x48);
          Node(pNVar3,nameBuffer);
          setParent(pNVar3,this);
          pNVar3 = find(pNVar3,path);
          return pNVar3;
        }
        pNVar3 = find(nn,path);
        if (pNVar3 != (Node *)0x0) break;
        nn = nn->next_;
      }
      return pNVar3;
    }
  }
  return (Node *)0x0;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::find( const char *path ) {
  int len = (int) strlen( path_ );
  if ( strncmp( path, path_, len ) == 0 ) {
    if ( path[ len ] == 0 )
      return this;
    if ( path[ len ] == '/' ) {
      Node *nd;
      for ( nd = child_; nd; nd = nd->next_ ) {
	Node *nn = nd->find( path );
	if ( nn ) return nn;
      }
      const char *s = path+len+1;
      const char *e = strchr( s, '/' );
      if (e) strlcpy( nameBuffer, s, e-s+1 );
      else strlcpy( nameBuffer, s, sizeof(nameBuffer));
      nd = new Node( nameBuffer );
      nd->setParent( this );
      return nd->find( path );
    }
  }
  return 0;
}